

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O1

json_t * gravity_compiler_serialize(gravity_compiler_t *compiler,gravity_closure_t *closure)

{
  json_t *json;
  
  if (closure == (gravity_closure_t *)0x0) {
    json = (json_t *)0x0;
  }
  else {
    json = json_new();
    json_begin_object(json,(char *)0x0);
    gravity_function_serialize(closure->f,json);
    json_end_object(json);
  }
  return json;
}

Assistant:

json_t *gravity_compiler_serialize (gravity_compiler_t *compiler, gravity_closure_t *closure) {
    #pragma unused(compiler)
    if (!closure) return NULL;

    json_t *json = json_new();
    json_begin_object(json, NULL);

    gravity_function_serialize(closure->f, json);

    json_end_object(json);
    return json;
}